

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

OnCallSpec<test_result_(fmt::v5::basic_string_view<wchar_t>)> * __thiscall
testing::internal::OnCallSpec<test_result_(fmt::v5::basic_string_view<wchar_t>)>::WillByDefault
          (OnCallSpec<test_result_(fmt::v5::basic_string_view<wchar_t>)> *this,
          Action<test_result_(fmt::v5::basic_string_view<wchar_t>)> *action)

{
  bool bVar1;
  undefined1 property;
  OnCallSpec<test_result_(fmt::v5::basic_string_view<wchar_t>)> *in_RDI;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  UntypedOnCallSpecBase *in_stack_ffffffffffffff70;
  UntypedOnCallSpecBase *this_00;
  undefined1 local_69 [56];
  allocator local_31;
  string local_30 [48];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_30,".WillByDefault() must appear exactly once in an ON_CALL().",&local_31);
  UntypedOnCallSpecBase::ExpectSpecProperty
            (in_stack_ffffffffffffff70,(bool)in_stack_ffffffffffffff6f,(string *)0x17cd61);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  (in_RDI->super_UntypedOnCallSpecBase).last_clause_ = kWillByDefault;
  bVar1 = Action<test_result_(fmt::v5::basic_string_view<wchar_t>)>::IsDoDefault
                    ((Action<test_result_(fmt::v5::basic_string_view<wchar_t>)> *)0x17cd90);
  property = !bVar1;
  this_00 = (UntypedOnCallSpecBase *)local_69;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(local_69 + 1),"DoDefault() cannot be used in ON_CALL().",
             (allocator *)this_00);
  UntypedOnCallSpecBase::ExpectSpecProperty(this_00,(bool)property,(string *)0x17cdd6);
  std::__cxx11::string::~string((string *)(local_69 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_69);
  Action<test_result_(fmt::v5::basic_string_view<wchar_t>)>::operator=
            ((Action<test_result_(fmt::v5::basic_string_view<wchar_t>)> *)this_00,
             (Action<test_result_(fmt::v5::basic_string_view<wchar_t>)> *)
             CONCAT17(property,in_stack_ffffffffffffff68));
  return in_RDI;
}

Assistant:

OnCallSpec& WillByDefault(const Action<F>& action) {
    ExpectSpecProperty(last_clause_ < kWillByDefault,
                       ".WillByDefault() must appear "
                       "exactly once in an ON_CALL().");
    last_clause_ = kWillByDefault;

    ExpectSpecProperty(!action.IsDoDefault(),
                       "DoDefault() cannot be used in ON_CALL().");
    action_ = action;
    return *this;
  }